

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testInvalidUpsampleNearestNeighborsModeWithAlignCorners(void)

{
  bool bVar1;
  ModelDescription *pMVar2;
  FeatureType *pFVar3;
  ostream *poVar4;
  Result local_d8;
  Result local_a8;
  UpsampleLayerParams *params;
  NeuralNetworkLayer *upsampleLayer;
  NeuralNetwork *nn;
  FeatureDescription *out3;
  ArrayFeatureType *shape;
  FeatureDescription *local_48;
  FeatureDescription *topIn;
  Model m1;
  
  CoreML::Specification::Model::Model((Model *)&topIn);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  local_48 = CoreML::Specification::ModelDescription::add_input(pMVar2);
  CoreML::Specification::FeatureDescription::set_name(local_48,"input");
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type(local_48);
  out3 = (FeatureDescription *)CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)out3,5);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)out3,5);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)out3,5);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  nn = (NeuralNetwork *)CoreML::Specification::ModelDescription::add_output(pMVar2);
  CoreML::Specification::FeatureDescription::set_name((FeatureDescription *)nn,"probs");
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type((FeatureDescription *)nn);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  upsampleLayer =
       (NeuralNetworkLayer *)CoreML::Specification::Model::mutable_neuralnetwork((Model *)&topIn);
  CoreML::Specification::NeuralNetwork::set_arrayinputshapemapping
            ((NeuralNetwork *)upsampleLayer,EXACT_ARRAY_MAPPING);
  params = (UpsampleLayerParams *)
           CoreML::Specification::NeuralNetwork::add_layers((NeuralNetwork *)upsampleLayer);
  CoreML::Specification::NeuralNetworkLayer::add_input((NeuralNetworkLayer *)params,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output((NeuralNetworkLayer *)params,"probs");
  local_a8.m_message._M_storage._M_storage =
       (uchar  [8])
       CoreML::Specification::NeuralNetworkLayer::mutable_upsample((NeuralNetworkLayer *)params);
  CoreML::Specification::UpsampleLayerParams::set_mode
            ((UpsampleLayerParams *)local_a8.m_message._M_storage._M_storage,
             UpsampleLayerParams_InterpolationMode_NN);
  CoreML::Specification::UpsampleLayerParams::set_linearupsamplemode
            ((UpsampleLayerParams *)local_a8.m_message._M_storage._M_storage,
             UpsampleLayerParams_LinearUpsampleMode_ALIGN_CORNERS_FALSE);
  CoreML::validate<(MLModelType)500>(&local_a8,(Model *)&topIn);
  bVar1 = CoreML::Result::good(&local_a8);
  if (bVar1) {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xbe4);
    poVar4 = std::operator<<(poVar4,": error: ");
    poVar4 = std::operator<<(poVar4,"!((res).good())");
    poVar4 = std::operator<<(poVar4," was false, expected true.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    m1._oneof_case_[0] = 1;
  }
  else {
    CoreML::Specification::UpsampleLayerParams::set_mode
              ((UpsampleLayerParams *)local_a8.m_message._M_storage._M_storage,
               UpsampleLayerParams_InterpolationMode_NN);
    CoreML::Specification::UpsampleLayerParams::set_linearupsamplemode
              ((UpsampleLayerParams *)local_a8.m_message._M_storage._M_storage,
               UpsampleLayerParams_LinearUpsampleMode_ALIGN_CORNERS_TRUE);
    CoreML::validate<(MLModelType)500>(&local_d8,(Model *)&topIn);
    CoreML::Result::operator=(&local_a8,&local_d8);
    CoreML::Result::~Result(&local_d8);
    bVar1 = CoreML::Result::good(&local_a8);
    if (bVar1) {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xbea);
      poVar4 = std::operator<<(poVar4,": error: ");
      poVar4 = std::operator<<(poVar4,"!((res).good())");
      poVar4 = std::operator<<(poVar4," was false, expected true.");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      m1._oneof_case_[0] = 1;
    }
    else {
      m1._oneof_case_[0] = 0;
    }
  }
  local_d8.m_message._M_storage._M_storage[4] = '\x01';
  local_d8.m_message._M_storage._M_storage[5] = '\0';
  local_d8.m_message._M_storage._M_storage[6] = '\0';
  local_d8.m_message._M_storage._M_storage[7] = '\0';
  CoreML::Result::~Result(&local_a8);
  CoreML::Specification::Model::~Model((Model *)&topIn);
  return m1._oneof_case_[0];
}

Assistant:

int testInvalidUpsampleNearestNeighborsModeWithAlignCorners() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(5);
    shape->add_shape(5);
    shape->add_shape(5);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    Specification::NeuralNetworkLayer *upsampleLayer = nn->add_layers();
    upsampleLayer->add_input("input");
    upsampleLayer->add_output("probs");
    auto *params = upsampleLayer->mutable_upsample();

    params->set_mode(Specification::UpsampleLayerParams_InterpolationMode::UpsampleLayerParams_InterpolationMode_NN);
    params->set_linearupsamplemode(Specification::UpsampleLayerParams_LinearUpsampleMode_ALIGN_CORNERS_FALSE);
    
    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);

    params->set_mode(Specification::UpsampleLayerParams_InterpolationMode::UpsampleLayerParams_InterpolationMode_NN);
    params->set_linearupsamplemode(Specification::UpsampleLayerParams_LinearUpsampleMode_ALIGN_CORNERS_TRUE);
    
    res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    return 0;
}